

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.hpp
# Opt level: O2

void __thiscall
bf_crc::bf_crc(bf_crc *this,uint16_t crc_width,uint32_t polynomial,bool probe_final_xor,
              uint32_t final_xor,bool probe_initial,uint32_t initial,bool probe_reflected_input,
              bool probe_reflected_output,FEED_TYPE feed_type)

{
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  *this_00;
  pointer pcVar1;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_16;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_17;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_8;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_9;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_32;
  crc_model_ local_3bc;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_25;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_24;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_7;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_6;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_12;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_11;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_5;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_13;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_15;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_10;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_4;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_31;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_14;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_30;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_3;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_29;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_28;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_27;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_26;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_23;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_22;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_21;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_20;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_19;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_18;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_2;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_1;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_0;
  
  (this->crc_model_match_).
  super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->crc_model_match_).
  super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->crc_model_match_).
  super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boost::mutex::mutex(&this->mymutex);
  this_00 = &this->known_models;
  (this->known_models).
  super__Vector_base<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->known_models).
  super__Vector_base<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->known_models).
  super__Vector_base<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  set_parameters(this,crc_width,polynomial,probe_final_xor,final_xor,probe_initial,initial,
                 probe_reflected_input,probe_reflected_output,feed_type);
  pcVar1 = (this->crc_model_match_).
           super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->crc_model_match_).
      super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar1) {
    (this->crc_model_match_).
    super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar1;
  }
  this->verbose_ = false;
  this->quiet_ = false;
  this->reflected_input_ = false;
  this->reflected_output_ = false;
  crc_0.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_0.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_0.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_0);
  crc_1.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_1.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_1.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_1);
  crc_2.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_2.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_2.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_2);
  crc_3.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  crc_4.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x700000003;
  crc_4.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)crc_4.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_finish._6_2_ << 0x30);
  crc_3.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_3.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_4.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_4.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ << 0x20);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_3,(crc_model_ *)&crc_4);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_3);
  crc_4.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  crc_5.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xf00000003;
  crc_5.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT26(crc_5.
                         super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._6_2_,0xf);
  crc_4.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_4.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_5.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_5.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ << 0x20);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_4,(crc_model_ *)&crc_5);
  crc_5.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3;
  crc_5.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT26(crc_5.
                         super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._6_2_,0x10100000000);
  crc_5.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_5.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_4,(crc_model_ *)&crc_5);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_4);
  crc_5.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  crc_6.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x900000009;
  crc_6.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)crc_6.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_finish._6_2_ << 0x30);
  crc_5.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_5.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_6.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_6.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ << 0x20);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_5,(crc_model_ *)&crc_6);
  crc_6.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1f00000015;
  crc_6.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT26(crc_6.
                         super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._6_2_,0x1010000001f);
  crc_6.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_6.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_5,(crc_model_ *)&crc_6);
  crc_6.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1f00000005;
  crc_6.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT26(crc_6.
                         super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._6_2_,0x1010000001f);
  crc_6.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_6.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_5,(crc_model_ *)&crc_6);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_5);
  crc_6.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  crc_7.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3f00000027;
  crc_7.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)crc_7.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_finish._6_2_ << 0x30);
  crc_6.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_6.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_7.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_7.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ << 0x20);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_6,(crc_model_ *)&crc_7);
  crc_7.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3f00000002;
  crc_7.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)crc_7.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffff000000000000);
  crc_7.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_7.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_6,(crc_model_ *)&crc_7);
  crc_7.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x19;
  crc_7.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT26(crc_7.
                         super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._6_2_,0x10100000000);
  crc_7.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_7.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_6,(crc_model_ *)&crc_7);
  crc_7.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3;
  crc_7.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT26(crc_7.
                         super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._6_2_,0x10100000000);
  crc_7.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_7.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_6,(crc_model_ *)&crc_7);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_6);
  crc_7.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  crc_8.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 9;
  crc_8.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_8.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ << 0x20);
  crc_8.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_8.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_7.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_7.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_8.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_7,(crc_model_ *)&crc_8);
  crc_8.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x4f;
  crc_8.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0x7f;
  crc_8.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_8.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0x101;
  crc_8.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_8.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_7,(crc_model_ *)&crc_8);
  crc_8.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x45;
  crc_8.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_8.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  crc_8.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_8.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_8.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_7,(crc_model_ *)&crc_8);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_7);
  crc_8.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 7;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_9.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ << 0x20);
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_8.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  crc_8.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_8.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_8.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_8.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._6_2_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_8,(crc_model_ *)&crc_9);
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x2f;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xff;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0xff;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_9.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_8,(crc_model_ *)&crc_9);
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9b;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xff;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_9.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_8,(crc_model_ *)&crc_9);
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x39;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0x101;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_9.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_8,(crc_model_ *)&crc_9);
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xd5;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_9.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_8,(crc_model_ *)&crc_9);
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1d;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xff;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0x101;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_9.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_8,(crc_model_ *)&crc_9);
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1d;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xfd;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_9.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_8,(crc_model_ *)&crc_9);
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 7;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0xff;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_9.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_8,(crc_model_ *)&crc_9);
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9b;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_9.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_8,(crc_model_ *)&crc_9);
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x31;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0x101;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_9.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_8,(crc_model_ *)&crc_9);
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x2f;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_9.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_8,(crc_model_ *)&crc_9);
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 7;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xff;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0x101;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_9.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_8,(crc_model_ *)&crc_9);
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1d;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xff;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0xff;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_9.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_8,(crc_model_ *)&crc_9);
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9b;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0x101;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_9.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_8,(crc_model_ *)&crc_9);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_8);
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._6_2_ = 0;
  crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_9);
  crc_10.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  crc_11.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x233;
  crc_11.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_11.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ << 0x20);
  crc_11.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_11.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_10.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_10.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_11.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_10,(crc_model_ *)&crc_11);
  crc_11.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x3d9;
  crc_11.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0x3ff;
  crc_11.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_11.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_11.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_11.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_10,(crc_model_ *)&crc_11);
  crc_11.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xbd;
  crc_11.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_11.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  crc_11.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_11.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_11.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_10,(crc_model_ *)&crc_11);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_10);
  crc_11.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  crc_12.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x385;
  crc_12.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0x1a;
  crc_12.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_12.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_11.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  crc_11.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_11.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_11.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_11.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._6_2_ = 0;
  crc_12.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_12.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ << 0x20);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_11,(crc_model_ *)&crc_12);
  crc_12.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x307;
  crc_12.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_12.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  crc_12.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_12.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_12.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_11,(crc_model_ *)&crc_12);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_11);
  crc_12.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  crc_13.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xf13;
  crc_13.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xfff;
  crc_13.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_13.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_12.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  crc_12.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_12.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_12.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_12.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._6_2_ = 0;
  crc_13.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_13.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ << 0x20);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_12,(crc_model_ *)&crc_13);
  crc_13.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x80f;
  crc_13.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_13.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  crc_13.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_13.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_13.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_12,(crc_model_ *)&crc_13);
  crc_13.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x80f;
  crc_13.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_13.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_13.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0x100;
  crc_13.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_13.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_12,(crc_model_ *)&crc_13);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_12);
  crc_13.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  crc_14.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1cf5;
  crc_14.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_14.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ << 0x20);
  crc_14.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_14.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_13.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  crc_13.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_13.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_13.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_13.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._6_2_ = 0;
  crc_14.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_13,(crc_model_ *)&crc_14);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_13);
  crc_14.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  crc_14.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_14.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_14.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_14.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._6_2_ = 0;
  crc_14.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  crc_15.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x805;
  crc_15.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT26(crc_15.
                         super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._6_2_,0x10100000000);
  crc_15.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_15.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ << 0x20);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_14,(crc_model_ *)&crc_15);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_14);
  crc_15.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  crc_16.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x4599;
  crc_16.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_16.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ << 0x20);
  crc_16.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_16.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_15.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_15.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_16.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_15,(crc_model_ *)&crc_16);
  crc_16.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x6815;
  crc_16.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_16.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 1;
  crc_16.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_16.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_16.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_15,(crc_model_ *)&crc_16);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_15);
  crc_16.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  crc_16.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_16.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_16.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_16.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._6_2_ = 0;
  crc_16.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8005;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0x101;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ << 0x20);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1021;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0x1d0f;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8005;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1021;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xffff;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xc867;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xffff;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8005;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xffff;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8005;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0x800d;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x589;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 1;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x589;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x3d65;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0xffff;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0x101;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x3d65;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0xffff;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1021;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xffff;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0xffff;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x6f63;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8005;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0xffff;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0x101;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1021;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xffff;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0x101;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x5935;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x755b;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1dcf;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xffff;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0xffff;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1021;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xb2aa;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0x101;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8bb7;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xa097;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1021;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0x89ec;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0x101;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8005;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xffff;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0xffff;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0x101;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1021;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xc6c6;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0x101;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1021;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0x101;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8005;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xffff;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0x101;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1021;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xffff;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0xffff;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0x101;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1021;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_17.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_16,(crc_model_ *)&crc_17);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_16);
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._6_2_ = 0;
  crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_17);
  crc_18.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_18.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_18.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_18);
  crc_19.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_19.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_19.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_19);
  crc_20.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_20.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_20.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_20);
  crc_21.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_21.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_21.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_21);
  crc_22.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_22.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_22.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_22);
  crc_23.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_23.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_23.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_23);
  crc_24.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x864cfb;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xb704ce;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_24.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_24.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_25.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ << 0x20);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_24,(crc_model_ *)&crc_25);
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x65b;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xffffff;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0x101;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_25.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_24,(crc_model_ *)&crc_25);
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x5d6dcb;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xfedcba;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_25.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_24,(crc_model_ *)&crc_25);
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x5d6dcb;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xabcdef;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_25.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_24,(crc_model_ *)&crc_25);
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x328b63;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0xffffff;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0xffffff;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_25.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_24,(crc_model_ *)&crc_25);
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x864cfb;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_25.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_24,(crc_model_ *)&crc_25);
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x800064;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_25.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_24,(crc_model_ *)&crc_25);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_24);
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._4_2_ = 0;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish._6_2_ = 0;
  crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_25);
  crc_26.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_26.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_26.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_26);
  crc_27.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_27.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_27.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_27);
  crc_28.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_28.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_28.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_28);
  crc_29.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_29.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_29.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_29);
  crc_30.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  crc_31.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3fffffff2030b8c7;
  crc_31.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT26(crc_31.
                         super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._6_2_,0x3fffffff);
  crc_30.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_30.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_31.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_31.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ << 0x20);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_30,(crc_model_ *)&crc_31);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_30);
  crc_31.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  crc_32.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x7fffffff04c11db7;
  crc_32.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT26(crc_32.
                         super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._6_2_,0x7fffffff);
  crc_31.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_31.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  crc_32.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)crc_32.
                        super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ << 0x20);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_31,(crc_model_ *)&crc_32);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_31);
  crc_32.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  crc_32.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  crc_32.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3bc.polynomial = 0x4c11db7;
  local_3bc.initial = 0xffffffff;
  local_3bc.final_xor = 0xffffffff;
  local_3bc.reflected_input = true;
  local_3bc.reflected_output = true;
  local_3bc.feed_type = AUTO;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_32,&local_3bc);
  local_3bc.polynomial = 0xf4acfb13;
  local_3bc.initial = 0xffffffff;
  local_3bc.final_xor = 0xffffffff;
  local_3bc.reflected_input = true;
  local_3bc.reflected_output = true;
  local_3bc.feed_type = AUTO;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_32,&local_3bc);
  local_3bc.polynomial = 0x4c11db7;
  local_3bc.initial = 0xffffffff;
  local_3bc.final_xor = 0xffffffff;
  local_3bc.reflected_input = false;
  local_3bc.reflected_output = false;
  local_3bc.feed_type = AUTO;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_32,&local_3bc);
  local_3bc.polynomial = 0x1edc6f31;
  local_3bc.initial = 0xffffffff;
  local_3bc.final_xor = 0xffffffff;
  local_3bc.reflected_input = true;
  local_3bc.reflected_output = true;
  local_3bc.feed_type = AUTO;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_32,&local_3bc);
  local_3bc.polynomial = 0xa833982b;
  local_3bc.initial = 0xffffffff;
  local_3bc.final_xor = 0xffffffff;
  local_3bc.reflected_input = true;
  local_3bc.reflected_output = true;
  local_3bc.feed_type = AUTO;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_32,&local_3bc);
  local_3bc.polynomial = 0x4c11db7;
  local_3bc.initial = 0xffffffff;
  local_3bc.final_xor = 0;
  local_3bc.reflected_input = false;
  local_3bc.reflected_output = false;
  local_3bc.feed_type = AUTO;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_32,&local_3bc);
  local_3bc.polynomial = 0x4c11db7;
  local_3bc.initial = 0;
  local_3bc.final_xor = 0xffffffff;
  local_3bc.reflected_input = false;
  local_3bc.reflected_output = false;
  local_3bc.feed_type = AUTO;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_32,&local_3bc);
  local_3bc.polynomial = 0x814141ab;
  local_3bc.feed_type = AUTO;
  local_3bc.initial = 0;
  local_3bc.final_xor = 0;
  local_3bc.reflected_input = false;
  local_3bc.reflected_output = false;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_32,&local_3bc);
  local_3bc.polynomial = 0x4c11db7;
  local_3bc.initial = 0xffffffff;
  local_3bc.final_xor = 0;
  local_3bc.reflected_input = true;
  local_3bc.reflected_output = true;
  local_3bc.feed_type = AUTO;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_32,&local_3bc);
  local_3bc.polynomial = 0xaf;
  local_3bc.feed_type = AUTO;
  local_3bc.initial = 0;
  local_3bc.final_xor = 0;
  local_3bc.reflected_input = false;
  local_3bc.reflected_output = false;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::
  emplace_back<bf_crc::crc_model_>(&crc_32,&local_3bc);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back(this_00,&crc_32);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_32.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_31.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_30.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_29.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_28.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_27.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_26.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_25.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_24.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_23.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_22.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_21.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_20.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_19.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_18.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_17.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_16.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_15.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_14.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_13.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_12.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_11.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_10.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_9.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_8.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_7.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_6.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_5.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_4.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_3.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_2.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_1.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  std::_Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~_Vector_base
            (&crc_0.super__Vector_base<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>);
  return;
}

Assistant:

bf_crc(	uint16_t crc_width, 
				uint32_t polynomial, 
				bool probe_final_xor, 
				uint32_t final_xor, 
				bool probe_initial, 
				uint32_t initial, 
				bool probe_reflected_input, 
			bool probe_reflected_output,
			my_crc_basic::FEED_TYPE feed_type) {
			set_parameters(	crc_width, 
							polynomial, 
							probe_final_xor, 
							final_xor, 
							probe_initial, 
							initial, 
							probe_reflected_input, 
					probe_reflected_output, feed_type);
			crc_model_match_.clear();
			verbose_ = false;
			quiet_ = false;
			reflected_input_ = false;
			reflected_output_ = false;


			// Polulate known models from http://reveng.sourceforge.net
			std::vector<crc_model_t> crc_0;
			known_models.push_back(crc_0);

			std::vector<crc_model_t> crc_1;
			known_models.push_back(crc_1);

			std::vector<crc_model_t> crc_2;
			known_models.push_back(crc_2);

			std::vector<crc_model_t> crc_3;
			{
				// width=3 poly=0x3 init=0x7 refin=true refout=true xorout=0x0 check=0x6 name="CRC-3/ROHC"
			  crc_3.push_back(crc_model_t(0x3, 0x7, 0x0, false, false, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_3);

			std::vector<crc_model_t> crc_4;
			{
				// width=4 poly=0x3 init=0xf refin=false refout=false xorout=0xf check=0xb name="CRC-4/INTERLAKEN"
				crc_4.push_back(crc_model_t(0x3, 0xf, 0xf, false, false, my_crc_basic::AUTO));
				// width=4 poly=0x3 init=0x0 refin=true refout=true xorout=0x0 check=0x7 name="CRC-4/ITU"
				crc_4.push_back(crc_model_t(0x3, 0x0, 0x0, true, true, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_4);

			std::vector<crc_model_t> crc_5;
			{
				// width=5 poly=0x09 init=0x09 refin=false refout=false xorout=0x00 check=0x00 name="CRC-5/EPC"
				crc_5.push_back(crc_model_t(0x09, 0x9, 0x0, false, false, my_crc_basic::AUTO));
				// width=5 poly=0x15 init=0x00 refin=true refout=true xorout=0x00 check=0x07 name="CRC-5/ITU"
				crc_5.push_back(crc_model_t(0x15, 0x1f, 0x1f, true, true, my_crc_basic::AUTO));
				// width=5 poly=0x05 init=0x1f refin=true refout=true xorout=0x1f check=0x19 name="CRC-5/USB"
				crc_5.push_back(crc_model_t(0x05, 0x1f, 0x1f, true, true, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_5);

			std::vector<crc_model_t> crc_6;
			{
				// width=6 poly=0x27 init=0x3f refin=false refout=false xorout=0x00 check=0x0d name="CRC-6/CDMA2000-A"
				crc_6.push_back(crc_model_t(0x27, 0x3f, 0x00, false, false, my_crc_basic::AUTO));
				// width=6 poly=0x07 init=0x3f refin=false refout=false xorout=0x00 check=0x3b name="CRC-6/CDMA2000-B"
				crc_6.push_back(crc_model_t(0x02, 0x3f, 0x00, false, false, my_crc_basic::AUTO));
				// width=6 poly=0x19 init=0x00 refin=true refout=true xorout=0x00 check=0x26 name="CRC-6/DARC"
				crc_6.push_back(crc_model_t(0x19, 0x00, 0x00, true, true, my_crc_basic::AUTO));
				// width=6 poly=0x03 init=0x00 refin=true refout=true xorout=0x00 check=0x06 name="CRC-6/ITU"
				crc_6.push_back(crc_model_t(0x03, 0x00, 0x00, true, true, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_6);

			std::vector<crc_model_t> crc_7;
			{
				// width=7 poly=0x09 init=0x00 refin=false refout=false xorout=0x00 check=0x75 name="CRC-7"
				crc_7.push_back(crc_model_t(0x09, 0x00, 0x00, false, false, my_crc_basic::AUTO));
				// width=7 poly=0x4f init=0x7f refin=true refout=true xorout=0x00 check=0x53 name="CRC-7/ROHC"
				crc_7.push_back(crc_model_t(0x4f, 0x7f, 0x00, true, true, my_crc_basic::AUTO));
				// width=7 poly=0x45 init=0x00 refin=false refout=false xorout=0x00 check=0x61 name="CRC-7/UMTS"
				crc_7.push_back(crc_model_t(0x45, 0x00, 0x00, false, false, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_7);

			std::vector<crc_model_t> crc_8;
			{
				// width=8 poly=0x07 init=0x00 refin=false refout=false xorout=0x00 check=0xf4 name="CRC-8"
				crc_8.push_back(crc_model_t(0x07, 0x00, 0x00, false, false, my_crc_basic::AUTO));
				// width=8 poly=0x2f init=0xff refin=false refout=false xorout=0xff check=0xdf name="CRC-8/AUTOSAR"
				crc_8.push_back(crc_model_t(0x2f, 0xff, 0xff, false, false, my_crc_basic::AUTO));
				// width=8 poly=0x9b init=0xff refin=false refout=false xorout=0x00 check=0xda name="CRC-8/CDMA2000"
				crc_8.push_back(crc_model_t(0x9b, 0xff, 0x00, false, false, my_crc_basic::AUTO));
				// width=8 poly=0x39 init=0x00 refin=true refout=true xorout=0x00 check=0x15 name="CRC-8/DARC"
				crc_8.push_back(crc_model_t(0x39, 0x00, 0x00, true, true, my_crc_basic::AUTO));
				// width=8 poly=0xd5 init=0x00 refin=false refout=false xorout=0x00 check=0xbc name="CRC-8/DVB-S2"
				crc_8.push_back(crc_model_t(0xd5, 0x00, 0x00, false, false, my_crc_basic::AUTO));
				// width=8 poly=0x1d init=0xff refin=true refout=true xorout=0x00 check=0x97 name="CRC-8/EBU"
				crc_8.push_back(crc_model_t(0x1d, 0xff, 0x00, true, true, my_crc_basic::AUTO));
				// width=8 poly=0x1d init=0xfd refin=false refout=false xorout=0x00 check=0x7e name="CRC-8/I-CODE"
				crc_8.push_back(crc_model_t(0x1d, 0xfd, 0x00, false, false, my_crc_basic::AUTO));
				// width=8 poly=0x07 init=0x00 refin=false refout=false xorout=0x55 check=0xa1 name="CRC-8/ITU"
				crc_8.push_back(crc_model_t(0x07, 0x00, 0xff, false, false, my_crc_basic::AUTO));
				// width=8 poly=0x9b init=0x00 refin=false refout=false xorout=0x00 check=0xea name="CRC-8/LTE"
				crc_8.push_back(crc_model_t(0x9b, 0x00, 0x00, false, false, my_crc_basic::AUTO));
				// width=8 poly=0x31 init=0x00 refin=true refout=true xorout=0x00 check=0xa1 name="CRC-8/MAXIM"
				crc_8.push_back(crc_model_t(0x31, 0x00, 0x00, true, true, my_crc_basic::AUTO));
				// width=8 poly=0x2f init=0x00 refin=false refout=false xorout=0x00 check=0x3e name="CRC-8/OPENSAFETY"
				crc_8.push_back(crc_model_t(0x2f, 0x00, 0x00, false, false, my_crc_basic::AUTO));
				// width=8 poly=0x07 init=0xff refin=true refout=true xorout=0x00 check=0xd0 name="CRC-8/ROHC"
				crc_8.push_back(crc_model_t(0x07, 0xff, 0x00, true, true, my_crc_basic::AUTO));
				// width=8 poly=0x1d init=0xff refin=false refout=false xorout=0xff check=0x4b name="CRC-8/SAE-J1850"
				crc_8.push_back(crc_model_t(0x1d, 0xff, 0xff, false, false, my_crc_basic::AUTO));
				// width=8 poly=0x9b init=0x00 refin=true refout=true xorout=0x00 check=0x25 name="CRC-8/WCDMA"
				crc_8.push_back(crc_model_t(0x9b, 0x00, 0x00, true, true, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_8);

			std::vector<crc_model_t> crc_9;
			known_models.push_back(crc_9);

			std::vector<crc_model_t> crc_10;
			{	
				// width=10 poly=0x233 init=0x000 refin=false refout=false xorout=0x000 check=0x199 name="CRC-10"
				crc_10.push_back(crc_model_t(0x233, 0x000, 0x000, false, false, my_crc_basic::AUTO));
				// width=10 poly=0x3d9 init=0x3ff refin=false refout=false xorout=0x000 check=0x233 name="CRC-10/CDMA2000"
				crc_10.push_back(crc_model_t(0x3d9, 0x3ff, 0x000, false, false, my_crc_basic::AUTO));
				crc_10.push_back(crc_model_t(0x0bd, 0x00, 0x00, false, false, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_10);

			std::vector<crc_model_t> crc_11;
			{
				// width=11 poly=0x385 init=0x01a refin=false refout=false xorout=0x000 check=0x5a3 name="CRC-11"
				crc_11.push_back(crc_model_t(0x385, 0x01a, 0x000, false, false, my_crc_basic::AUTO));
				// width=11 poly=0x307 init=0x000 refin=false refout=false xorout=0x000 check=0x061 name="CRC-11/UMTS"
				crc_11.push_back(crc_model_t(0x307, 0x000, 0x000, false, false, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_11);

			std::vector<crc_model_t> crc_12;
			{
				// width=12 poly=0xf13 init=0xfff refin=false refout=false xorout=0x000 check=0xd4d name="CRC-12/CDMA2000"
				crc_12.push_back(crc_model_t(0xf13, 0xfff, 0x000, false, false, my_crc_basic::AUTO));
				// width=12 poly=0x80f init=0x000 refin=false refout=false xorout=0x000 check=0xf5b name="CRC-12/DECT"
				crc_12.push_back(crc_model_t(0x80f, 0x000, 0x000, false ,false, my_crc_basic::AUTO));
				// width=12 poly=0x80f init=0x000 refin=false refout=true xorout=0x000 check=0xdaf name="CRC-12/UMTS"
				crc_12.push_back(crc_model_t(0x80f, 0x000, 0x000, false, true, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_12);

			std::vector<crc_model_t> crc_13;
			{
				// width=13 poly=0x1cf5 init=0x0000 refin=false refout=false xorout=0x0000 check=0x04fa name="CRC-13/BBC"
				crc_13.push_back(crc_model_t(0x1cf5, 0x0000, 0x0000, false, false, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_13);

			std::vector<crc_model_t> crc_14;
			{
				// width=14 poly=0x0805 init=0x0000 refin=true refout=true xorout=0x0000 check=0x082d name="CRC-14/DARC"
				crc_14.push_back(crc_model_t(0x0805, 0x0000, 0x0000, true, true, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_14);

			std::vector<crc_model_t> crc_15;
			{
				// width=15 poly=0x4599 init=0x0000 refin=false refout=false xorout=0x0000 check=0x059e name="CRC-15"
				crc_15.push_back(crc_model_t(0x4599, 0x0000, 0x0000, false, false, my_crc_basic::AUTO));
				// width=15 poly=0x6815 init=0x0000 refin=false refout=false xorout=0x0001 check=0x2566 name="CRC-15/MPT1327"
				crc_15.push_back(crc_model_t(0x6815, 0x0000, 0x0001, false, false, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_15);

			std::vector<crc_model_t> crc_16;
			{
				//width=16 poly=0x8005 init=0x0000 refin=true refout=true xorout=0x0000 check=0xbb3d name="ARC"
				crc_16.push_back(crc_model_t(0x8005, 0x0000, 0x0000, true, true, my_crc_basic::AUTO));
				//width=16 poly=0x1021 init=0x1d0f refin=false refout=false xorout=0x0000 check=0xe5cc name="CRC-16/AUG-CCITT"
				crc_16.push_back(crc_model_t(0x1021, 0x1d0f, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x8005 init=0x0000 refin=false refout=false xorout=0x0000 check=0xfee8 name="CRC-16/BUYPASS"
				crc_16.push_back(crc_model_t(0x8005, 0x0000, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x1021 init=0xffff refin=false refout=false xorout=0x0000 check=0x29b1 name="CRC-16/CCITT-FALSE"
				crc_16.push_back(crc_model_t(0x1021, 0xffff, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0xc867 init=0xffff refin=false refout=false xorout=0x0000 check=0x4c06 name="CRC-16/CDMA2000"
				crc_16.push_back(crc_model_t(0xc867, 0xffff, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x8005 init=0xffff refin=false refout=false xorout=0x0000 check=0xaee7 name="CRC-16/CMS"
				crc_16.push_back(crc_model_t(0x8005, 0xffff, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x8005 init=0x800d refin=false refout=false xorout=0x0000 check=0x9ecf name="CRC-16/DDS-110"
				crc_16.push_back(crc_model_t(0x8005, 0x800d, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x0589 init=0x0000 refin=false refout=false xorout=0x0001 check=0x007e name="CRC-16/DECT-R"
				crc_16.push_back(crc_model_t(0x0589, 0x0000, 0x0001, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x0589 init=0x0000 refin=false refout=false xorout=0x0000 check=0x007f name="CRC-16/DECT-X"
				crc_16.push_back(crc_model_t(0x0589, 0x0000, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x3d65 init=0x0000 refin=true refout=true xorout=0xffff check=0xea82 name="CRC-16/DNP"
				crc_16.push_back(crc_model_t(0x3d65, 0x0000, 0xffff, true, true, my_crc_basic::AUTO));
				//width=16 poly=0x3d65 init=0x0000 refin=false refout=false xorout=0xffff check=0xc2b7 name="CRC-16/EN-13757"
				crc_16.push_back(crc_model_t(0x3d65, 0x0000, 0xffff, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x1021 init=0xffff refin=false refout=false xorout=0xffff check=0xd64e name="CRC-16/GENIBUS"
				crc_16.push_back(crc_model_t(0x1021, 0xffff, 0xffff, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x6f63 init=0x0000 refin=false refout=false xorout=0x0000 check=0xbdf4 name="CRC-16/LJ1200"
				crc_16.push_back(crc_model_t(0x6f63, 0x0000, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x8005 init=0x0000 refin=true refout=true xorout=0xffff check=0x44c2 name="CRC-16/MAXIM"
				crc_16.push_back(crc_model_t(0x8005, 0x0000, 0xffff, true, true, my_crc_basic::AUTO));
				//width=16 poly=0x1021 init=0xffff refin=true refout=true xorout=0x0000 check=0x6f91 name="CRC-16/MCRF4XX"
				crc_16.push_back(crc_model_t(0x1021, 0xffff, 0x0000, true, true, my_crc_basic::AUTO));
				//width=16 poly=0x5935 init=0x0000 refin=false refout=false xorout=0x0000 check=0x5d38 name="CRC-16/OPENSAFETY-A"
				crc_16.push_back(crc_model_t(0x5935, 0x0000, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x755b init=0x0000 refin=false refout=false xorout=0x0000 check=0x20fe name="CRC-16/OPENSAFETY-B"
				crc_16.push_back(crc_model_t(0x755b, 0x0000, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x1dcf init=0xffff refin=false refout=false xorout=0xffff check=0xa819 name="CRC-16/PROFIBUS"
				crc_16.push_back(crc_model_t(0x1dcf, 0xffff, 0xffff, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x1021 init=0xb2aa refin=true refout=true xorout=0x0000 check=0x63d0 name="CRC-16/RIELLO"
				crc_16.push_back(crc_model_t(0x1021, 0xb2aa, 0x0000, true, true, my_crc_basic::AUTO));
				///width=16 poly=0x8bb7 init=0x0000 refin=false refout=false xorout=0x0000 check=0xd0db name="CRC-16/T10-DIF"
				crc_16.push_back(crc_model_t(0x8bb7, 0x0000, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0xa097 init=0x0000 refin=false refout=false xorout=0x0000 check=0x0fb3 name="CRC-16/TELEDISK"
				crc_16.push_back(crc_model_t(0xa097, 0x0000, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x1021 init=0x89ec refin=true refout=true xorout=0x0000 check=0x26b1 name="CRC-16/TMS37157"
				crc_16.push_back(crc_model_t(0x1021, 0x89ec, 0x0000, true, true, my_crc_basic::AUTO));
				//width=16 poly=0x8005 init=0xffff refin=true refout=true xorout=0xffff check=0xb4c8 name="CRC-16/USB"
				crc_16.push_back(crc_model_t(0x8005, 0xffff, 0xffff, true, true, my_crc_basic::AUTO));
				//width=16 poly=0x1021 init=0xc6c6 refin=true refout=true xorout=0x0000 check=0xbf05 name="CRC-A"
				crc_16.push_back(crc_model_t(0x1021, 0xc6c6, 0x0000, true, true, my_crc_basic::AUTO));
				//width=16 poly=0x1021 init=0x0000 refin=true refout=true xorout=0x0000 check=0x2189 name="KERMIT"
				crc_16.push_back(crc_model_t(0x1021, 0x0000, 0x0000, true, true, my_crc_basic::AUTO));
				//width=16 poly=0x8005 init=0xffff refin=true refout=true xorout=0x0000 check=0x4b37 name="MODBUS"
				crc_16.push_back(crc_model_t(0x8005, 0xffff, 0x0000, true, true, my_crc_basic::AUTO));
				//width=16 poly=0x1021 init=0xffff refin=true refout=true xorout=0xffff check=0x906e name="X-25"
				crc_16.push_back(crc_model_t(0x1021, 0xffff, 0xffff, true, true, my_crc_basic::AUTO));
				//width=16 poly=0x1021 init=0x0000 refin=false refout=false xorout=0x0000 check=0x31c3 name="XMODEM"	
				crc_16.push_back(crc_model_t(0x1021, 0x0000, 0x0000, false, false, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_16);

			std::vector<crc_model_t> crc_17;
			known_models.push_back(crc_17);
	
			std::vector<crc_model_t> crc_18;
			known_models.push_back(crc_18);

			std::vector<crc_model_t> crc_19;
			known_models.push_back(crc_19);

			std::vector<crc_model_t> crc_20;
			known_models.push_back(crc_20);

			std::vector<crc_model_t> crc_21;
			known_models.push_back(crc_21);

			std::vector<crc_model_t> crc_22;
			known_models.push_back(crc_22);

			std::vector<crc_model_t> crc_23;
			known_models.push_back(crc_23);

			std::vector<crc_model_t> crc_24;
			{
				// width=24 poly=0x864cfb init=0xb704ce refin=false refout=false xorout=0x000000 check=0x21cf02 name="CRC-24"
				crc_24.push_back(crc_model_t(0x864cfb, 0xb704ce, 0x000000, false, false, my_crc_basic::AUTO));
				// width=24 poly=0x00065b init=0x555555 refin=true refout=true xorout=0x000000 check=0xc25a56 name="CRC-24/BLE"
				crc_24.push_back(crc_model_t(0x00065b, 0xffffff, 0x000000, true, true, my_crc_basic::AUTO));
				// width=24 poly=0x5d6dcb init=0xfedcba refin=false refout=false xorout=0x000000 check=0x7979bd name="CRC-24/FLEXRAY-A"
				crc_24.push_back(crc_model_t(0x5d6dcb, 0xfedcba, 0x000000, false, false, my_crc_basic::AUTO));
				// width=24 poly=0x5d6dcb init=0xabcdef refin=false refout=false xorout=0x000000 check=0x1f23b8 name="CRC-24/FLEXRAY-B"
				crc_24.push_back(crc_model_t(0x5d6dcb, 0xabcdef, 0x000000, false, false, my_crc_basic::AUTO));
				// width=24 poly=0x328b63 init=0xffffff refin=false refout=false xorout=0xffffff check=0xb4f3e6 name="CRC-24/INTERLAKEN"
				crc_24.push_back(crc_model_t(0x328b63, 0xffffff, 0xffffff, false, false, my_crc_basic::AUTO));
				// width=24 poly=0x864cfb init=0x000000 refin=false refout=false xorout=0x000000 check=0xcde703 name="CRC-24/LTE-A"
				crc_24.push_back(crc_model_t(0x864cfb, 0x000000, 0x000000, false, false, my_crc_basic::AUTO));
				// width=24 poly=0x800063 init=0x000000 refin=false refout=false xorout=0x000000 check=0x23ef52 name="CRC-24/LTE-B"
				crc_24.push_back(crc_model_t(0x800064, 0x000000, 0x000000, false, false, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_24);

			std::vector<crc_model_t> crc_25;
			known_models.push_back(crc_25);

			std::vector<crc_model_t> crc_26;
			known_models.push_back(crc_26);

			std::vector<crc_model_t> crc_27;
			known_models.push_back(crc_27);

			std::vector<crc_model_t> crc_28;
			known_models.push_back(crc_28);

			std::vector<crc_model_t> crc_29;
			known_models.push_back(crc_29);


			std::vector<crc_model_t> crc_30;
			{
				// width=30 poly=0x2030b9c7 init=0x3fffffff refin=false refout=false xorout=0x3fffffff check=0x04c34abf name="CRC-30/CDMA"
				crc_30.push_back(crc_model_t(0x2030b8c7, 0x3fffffff, 0x3fffffff, false, false, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_30);

			std::vector<crc_model_t> crc_31;
			{
				// width=31 poly=0x04c11db7 init=0x7fffffff refin=false refout=false xorout=0x7fffffff check=0x0ce9e46c name="CRC-31/PHILIPS"
				crc_31.push_back(crc_model_t(0x04c11db7, 0x7fffffff, 0x7fffffff, false, false, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_31);

			std::vector<crc_model_t> crc_32;
			{
				// width=32 poly=0x04c11db7 init=0xffffffff refin=true refout=true xorout=0xffffffff check=0xcbf43926 name="CRC-32"
				crc_32.push_back(crc_model_t(0x04c11db7, 0xffffffff, 0xffffffff, true, true, my_crc_basic::AUTO));
				// width=32 poly=0xf4acfb13 init=0xffffffff refin=true refout=true xorout=0xffffffff check=0x1697d06a name="CRC-32/AUTOSAR"
				crc_32.push_back(crc_model_t(0xf4acfb13, 0xffffffff, 0xffffffff, true, true, my_crc_basic::AUTO));
				// width=32 poly=0x04c11db7 init=0xffffffff refin=false refout=false xorout=0xffffffff check=0xfc891918 name="CRC-32/BZIP2"
				crc_32.push_back(crc_model_t(0x04c11db7, 0xffffffff, 0xffffffff, false, false, my_crc_basic::AUTO));
				// width=32 poly=0x1edc6f41 init=0xffffffff refin=true refout=true xorout=0xffffffff check=0xe3069283 name="CRC-32C"
				crc_32.push_back(crc_model_t(0x1edc6f31, 0xffffffff, 0xffffffff, true, true, my_crc_basic::AUTO));
				// width=32 poly=0xa833982b init=0xffffffff refin=true refout=true xorout=0xffffffff check=0x87315576 name="CRC-32D"
				crc_32.push_back(crc_model_t(0xa833982b, 0xffffffff, 0xffffffff, true, true, my_crc_basic::AUTO));
				// width=32 poly=0x04c11db7 init=0xffffffff refin=false refout=false xorout=0x00000000 check=0x0376e6e7 name="CRC-32/MPEG-2"
				crc_32.push_back(crc_model_t(0x04c11db7, 0xffffffff, 0x00000000, false, false, my_crc_basic::AUTO));
				// width=32 poly=0x04c11db7 init=0x00000000 refin=false refout=false xorout=0xffffffff check=0x765e7680 name="CRC-32/POSIX"
				crc_32.push_back(crc_model_t(0x04c11db7, 0x00000000, 0xffffffff, false, false, my_crc_basic::AUTO));
				// width=32 poly=0x814141ab init=0x00000000 refin=false refout=false xorout=0x00000000 check=0x3010bf7f name="CRC-32Q"
				crc_32.push_back(crc_model_t(0x814141ab, 0x00000000, 0x00000000, false, false, my_crc_basic::AUTO));
				// width=32 poly=0x04c11db7 init=0xffffffff refin=true refout=true xorout=0x00000000 check=0x340bc6d9 name="JAMCRC"
				crc_32.push_back(crc_model_t(0x04c11db7, 0xffffffff, 0x00000000, true, true, my_crc_basic::AUTO));
				// width=32 poly=0x000000af init=0x00000000 refin=false refout=false xorout=0x00000000 check=0xbd0be338 name="XFER"
				crc_32.push_back(crc_model_t(0x000000af, 0x00000000, 0x00000000, false, false, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_32);

		}